

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void __thiscall FileEntryInfo::addExtent(FileEntryInfo *this,Extent *extent)

{
  pointer *ppEVar1;
  Extent *pEVar2;
  iterator __position;
  ulong uVar3;
  int64_t iVar4;
  undefined4 uVar5;
  long lVar6;
  ulong uVar7;
  
  pEVar2 = (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pEVar2 == __position._M_current) {
    if (pEVar2 == (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
LAB_0018e619:
      std::vector<Extent,std::allocator<Extent>>::_M_realloc_insert<Extent_const&>
                ((vector<Extent,std::allocator<Extent>> *)&this->m_extents,__position,extent);
      goto LAB_0018e621;
    }
  }
  else {
    uVar3 = __position._M_current[-1].size;
    uVar7 = uVar3 + 0x7ff;
    if (-1 < (long)uVar3) {
      uVar7 = uVar3;
    }
    if (((int)(uVar7 >> 0xb) + __position._M_current[-1].lbnPos == extent->lbnPos) &&
       (lVar6 = uVar3 + extent->size, lVar6 < 0x40000000)) {
      __position._M_current[-1].size = lVar6;
      goto LAB_0018e621;
    }
    if (__position._M_current ==
        (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0018e619;
  }
  uVar5 = *(undefined4 *)&extent->field_0x4;
  iVar4 = extent->size;
  (__position._M_current)->lbnPos = extent->lbnPos;
  *(undefined4 *)&(__position._M_current)->field_0x4 = uVar5;
  (__position._M_current)->size = iVar4;
  ppEVar1 = &(this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppEVar1 = *ppEVar1 + 1;
LAB_0018e621:
  this->m_fileSize = this->m_fileSize + extent->size;
  return;
}

Assistant:

void FileEntryInfo::addExtent(const Extent &extent)
{
    if (m_extents.empty())
    {
        m_extents.push_back(extent);
    }
    else
    {
        const int lastLBN = m_extents.rbegin()->lbnPos + static_cast<int>(m_extents.rbegin()->size / SECTOR_SIZE);
        if (lastLBN == extent.lbnPos && m_extents.rbegin()->size + extent.size < MAX_EXTENT_SIZE)
            m_extents.rbegin()->size += extent.size;
        else
            m_extents.push_back(extent);
    }
    m_fileSize += extent.size;
}